

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple pybind11::make_tuple<(pybind11::return_value_policy)1,pybind11::str&>(str *args_)

{
  handle hVar1;
  handle h;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  handle *this;
  undefined8 uVar6;
  PyObject **ppPVar7;
  object in_RDI;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_1UL> *__range2;
  int counter;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  argtypes;
  size_t i;
  array<pybind11::object,_1UL> args;
  size_t size;
  tuple *result;
  undefined7 in_stack_fffffffffffffe68;
  return_value_policy in_stack_fffffffffffffe6f;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  PyTypeObject *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  tuple *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  handle local_e8;
  iterator local_e0;
  iterator local_d8;
  iterator local_d0;
  array<pybind11::object,_1UL> *local_c8;
  int local_c0;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined1 *local_78;
  undefined1 local_70 [32];
  ulong local_50;
  handle local_38;
  PyObject *local_30;
  array<pybind11::object,_1UL> *local_28;
  array<pybind11::object,_1UL> local_20;
  undefined8 local_18;
  
  local_18 = 1;
  local_28 = &local_20;
  handle::handle(&local_38,(PyObject *)0x0);
  hVar1.m_ptr._4_4_ = in_stack_fffffffffffffe7c;
  hVar1.m_ptr._0_4_ = in_stack_fffffffffffffe78;
  local_30 = (PyObject *)
             detail::pyobject_caster<pybind11::str>::cast
                       ((handle *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6f,hVar1);
  h.m_ptr._4_4_ = in_stack_fffffffffffffe7c;
  h.m_ptr._0_4_ = in_stack_fffffffffffffe78;
  reinterpret_steal<pybind11::object>(h);
  local_50 = 0;
  while( true ) {
    uVar2 = local_50;
    sVar5 = std::array<pybind11::object,_1UL>::size(&local_20);
    if (sVar5 <= uVar2) {
      local_ba = 0;
      tuple::tuple(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      local_c0 = 0;
      local_c8 = &local_20;
      local_d0 = std::array<pybind11::object,_1UL>::begin((array<pybind11::object,_1UL> *)0x141d20);
      local_d8 = std::array<pybind11::object,_1UL>::end((array<pybind11::object,_1UL> *)0x141d35);
      while( true ) {
        if (local_d0 == local_d8) {
          local_ba = 1;
          std::array<pybind11::object,_1UL>::~array
                    ((array<pybind11::object,_1UL> *)in_stack_fffffffffffffe80);
          return (tuple)in_RDI.super_handle.m_ptr;
        }
        local_e0 = local_d0;
        local_e8 = object::release((object *)
                                   CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
        ppPVar7 = handle::ptr(&local_e8);
        in_stack_fffffffffffffe80 = (PyTypeObject *)*ppPVar7;
        ppPVar7 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        iVar4 = PyType_HasFeature((*ppPVar7)->ob_type,0x4000000);
        if (iVar4 == 0) break;
        ppPVar7 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        (&(*ppPVar7)[1].ob_type)[local_c0] = in_stack_fffffffffffffe80;
        local_d0 = local_d0 + 1;
        local_c0 = local_c0 + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/amlucas[P]sdfTools/src/extern/pybind11/include/pybind11/cast.h"
                    ,0x3d9,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::str &>]"
                   );
    }
    this = &std::array<pybind11::object,_1UL>::operator[]
                      ((array<pybind11::object,_1UL> *)in_stack_fffffffffffffe70,
                       CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68))->super_handle;
    bVar3 = handle::operator_cast_to_bool(this);
    if (!bVar3) break;
    local_50 = local_50 + 1;
  }
  local_78 = local_70;
  type_id<pybind11::str&>();
  local_b9 = 1;
  uVar6 = __cxa_allocate_exception(0x10);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>::
  operator[](in_stack_fffffffffffffe70,CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68)
            );
  std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (char *)in_stack_fffffffffffffe70);
  cast_error::runtime_error
            ((cast_error *)in_stack_fffffffffffffe70,
             (string *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
  local_b9 = 0;
  __cxa_throw(uVar6,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}